

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

cmCPackInstallationType * __thiscall
cmCPackGenerator::GetInstallationType(cmCPackGenerator *this,string *projectName,string *name)

{
  size_type sVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char *local_88;
  char *displayName;
  string local_70;
  undefined1 local_50 [8];
  string macroPrefix;
  cmCPackInstallationType *installType;
  bool hasInstallationType;
  string *name_local;
  string *projectName_local;
  cmCPackGenerator *this_local;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
          ::count(&this->InstallationTypes,name);
  macroPrefix.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
       ::operator[](&this->InstallationTypes,name);
  if (sVar1 == 0) {
    cmsys::SystemTools::UpperCase(&local_70,name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "CPACK_INSTALL_TYPE_",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::operator=((string *)macroPrefix.field_2._8_8_,(string *)name);
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DISPLAY_NAME");
    pcVar2 = GetOption(this,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_88 = pcVar2;
    if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
      std::__cxx11::string::operator=
                ((string *)(macroPrefix.field_2._8_8_ + 0x20),(string *)macroPrefix.field_2._8_8_);
    }
    else {
      std::__cxx11::string::operator=((string *)(macroPrefix.field_2._8_8_ + 0x20),pcVar2);
    }
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
            ::size(&this->InstallationTypes);
    *(int *)(macroPrefix.field_2._8_8_ + 0x40) = (int)sVar1;
    std::__cxx11::string::~string((string *)local_50);
  }
  return (cmCPackInstallationType *)macroPrefix.field_2._8_8_;
}

Assistant:

cmCPackInstallationType*
cmCPackGenerator::GetInstallationType(const std::string& projectName,
                                      const std::string& name)
{
  (void) projectName;
  bool hasInstallationType = this->InstallationTypes.count(name) != 0;
  cmCPackInstallationType *installType = &this->InstallationTypes[name];
  if (!hasInstallationType)
    {
    // Define the installation type
    std::string macroPrefix = "CPACK_INSTALL_TYPE_"
      + cmsys::SystemTools::UpperCase(name);
    installType->Name = name;

    const char* displayName
      = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (displayName && *displayName)
      {
      installType->DisplayName = displayName;
      }
    else
      {
      installType->DisplayName = installType->Name;
      }

    installType->Index = static_cast<unsigned>(
      this->InstallationTypes.size());
    }
  return installType;
}